

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::TableScanInitGlobal(duckdb *this,ClientContext *context,TableFunctionInitInput *input)

{
  TableIndexList *__mutex;
  TableScanBindData *bind_data;
  TableCatalogEntry *this_00;
  pointer puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  DuckTransaction *info;
  shared_ptr<duckdb::DataTableInfo,_true> *psVar4;
  DataTableInfo *pDVar5;
  DBConfig *this_01;
  RETURN_TYPE RVar6;
  idx_t iVar7;
  ulong uVar8;
  ColumnList *column_list;
  type table_info;
  pointer pIVar9;
  undefined4 extraout_var_00;
  ART *art;
  pointer this_02;
  RETURN_TYPE_conflict RVar10;
  double dVar11;
  undefined1 auVar12 [16];
  unsafe_vector<row_t> row_ids;
  shared_ptr<duckdb::CheckpointLock,_true> checkpoint_lock;
  unsafe_vector<row_t> local_68;
  TableFilterSet *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  DataTable *storage;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  bind_data = (TableScanBindData *)(input->bind_data).ptr;
  this_00 = bind_data->table;
  iVar3 = (*(this_00->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
            _vptr_CatalogEntry[0x10])(this_00);
  storage = (DataTable *)CONCAT44(extraout_var,iVar3);
  if ((input->filters).ptr == (TableFilterSet *)0x0) {
    DuckTableScanInitGlobal(this,context,input,storage,bind_data);
  }
  else {
    optional_ptr<duckdb::TableFilterSet,_true>::CheckValid(&input->filters);
    local_48 = (input->filters).ptr;
    if ((local_48->filters)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
      info = DuckTransaction::Get(context,storage->db);
      psVar4 = DataTable::GetDataTableInfo(storage);
      shared_ptr<duckdb::DataTableInfo,_true>::operator*(psVar4);
      DuckTransaction::SharedLockTable
                ((DuckTransaction *)&stack0xffffffffffffffc0,(DataTableInfo *)info);
      psVar4 = DataTable::GetDataTableInfo(storage);
      pDVar5 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(psVar4);
      bVar2 = TableIndexList::Empty(&pDVar5->indexes);
      if (bVar2) {
        DuckTableScanInitGlobal(this,context,input,storage,bind_data);
      }
      else {
        this_01 = DBConfig::GetConfig(context);
        RVar10 = DBConfig::GetSetting<duckdb::IndexScanPercentageSetting>(this_01,context);
        RVar6 = DBConfig::GetSetting<duckdb::IndexScanMaxCountSetting>(this_01,context);
        iVar7 = DataTable::GetTotalRows(storage);
        auVar12._8_4_ = (int)(iVar7 >> 0x20);
        auVar12._0_8_ = iVar7;
        auVar12._12_4_ = 0x45300000;
        dVar11 = RVar10 * ((auVar12._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)iVar7) - 4503599627370496.0));
        uVar8 = (ulong)dVar11;
        uVar8 = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        if (uVar8 < RVar6) {
          uVar8 = RVar6;
        }
        column_list = TableCatalogEntry::GetColumns(this_00);
        local_68.super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        local_68.super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        local_68.super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        pDVar5 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(psVar4);
        table_info = shared_ptr<duckdb::DataTableInfo,_true>::operator*(psVar4);
        __mutex = &pDVar5->indexes;
        TableIndexList::InitializeIndexes(__mutex,context,table_info,"ART");
        iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar3 != 0) {
          ::std::__throw_system_error(iVar3);
        }
        puVar1 = (pDVar5->indexes).indexes.
                 super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_02 = (pDVar5->indexes).indexes.
                       super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar1;
            this_02 = this_02 + 1) {
          while( true ) {
            pIVar9 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                               (this_02);
            iVar3 = (*pIVar9->_vptr_Index[2])(pIVar9);
            if ((char)iVar3 == '\0') break;
            pIVar9 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                               (this_02);
            iVar3 = (*pIVar9->_vptr_Index[3])(pIVar9);
            iVar3 = ::std::__cxx11::string::compare((char *)CONCAT44(extraout_var_00,iVar3));
            if (iVar3 != 0) break;
            art = (ART *)unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::
                         operator->(this_02);
            bVar2 = TryScanIndex(art,column_list,input,local_48,uVar8,&local_68);
            this_02 = this_02 + 1;
            if (this_02 == puVar1 || bVar2) {
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              if (!bVar2) goto LAB_00a625d8;
              DuckIndexScanInitGlobal(this,context,input,bind_data,&local_68);
              goto LAB_00a625f1;
            }
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
LAB_00a625d8:
        DuckTableScanInitGlobal(this,context,input,storage,bind_data);
LAB_00a625f1:
        if (local_68.super_vector<long,_std::allocator<long>_>.
            super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
            != (pointer)0x0) {
          operator_delete(local_68.super_vector<long,_std::allocator<long>_>.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
    }
    else {
      DuckTableScanInitGlobal(this,context,input,storage,bind_data);
    }
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
          )this;
}

Assistant:

unique_ptr<GlobalTableFunctionState> TableScanInitGlobal(ClientContext &context, TableFunctionInitInput &input) {
	D_ASSERT(input.bind_data);

	auto &bind_data = input.bind_data->Cast<TableScanBindData>();
	auto &duck_table = bind_data.table.Cast<DuckTableEntry>();
	auto &storage = duck_table.GetStorage();

	// Can't index scan without filters.
	if (!input.filters) {
		return DuckTableScanInitGlobal(context, input, storage, bind_data);
	}
	auto &filter_set = *input.filters;

	// FIXME: We currently only support scanning one ART with one filter.
	// If multiple filters exist, i.e., a = 11 AND b = 24, we need to
	// 1.	1.1. Find + scan one ART for a = 11.
	//		1.2. Find + scan one ART for b = 24.
	//		1.3. Return the intersecting row IDs.
	// 2. (Reorder and) scan a single ART with a compound key of (a, b).
	if (filter_set.filters.size() != 1) {
		return DuckTableScanInitGlobal(context, input, storage, bind_data);
	}

	// The checkpoint lock ensures that we do not checkpoint while scanning this table.
	auto &transaction = DuckTransaction::Get(context, storage.db);
	auto checkpoint_lock = transaction.SharedLockTable(*storage.GetDataTableInfo());
	auto &info = storage.GetDataTableInfo();
	auto &indexes = info->GetIndexes();
	if (indexes.Empty()) {
		return DuckTableScanInitGlobal(context, input, storage, bind_data);
	}

	auto &db_config = DBConfig::GetConfig(context);
	auto scan_percentage = db_config.GetSetting<IndexScanPercentageSetting>(context);
	auto scan_max_count = db_config.GetSetting<IndexScanMaxCountSetting>(context);

	auto total_rows = storage.GetTotalRows();
	auto total_rows_from_percentage = LossyNumericCast<idx_t>(double(total_rows) * scan_percentage);
	auto max_count = MaxValue(scan_max_count, total_rows_from_percentage);

	auto &column_list = duck_table.GetColumns();
	bool index_scan = false;
	unsafe_vector<row_t> row_ids;

	info->GetIndexes().BindAndScan<ART>(context, *info, [&](ART &art) {
		index_scan = TryScanIndex(art, column_list, input, filter_set, max_count, row_ids);
		return index_scan;
	});

	if (!index_scan) {
		return DuckTableScanInitGlobal(context, input, storage, bind_data);
	}
	return DuckIndexScanInitGlobal(context, input, bind_data, row_ids);
}